

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::GetSectionHeaderByName(int fd,char *name,size_t name_len,Elf64_Shdr *out)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 local_118 [8];
  Elf64_Shdr shstrtab;
  char header_name [64];
  Elf64_Ehdr elf_header;
  
  bVar2 = false;
  bVar1 = ReadFromOffsetExact(fd,header_name + 0x38,0x40,0);
  if (bVar1) {
    bVar2 = ReadFromOffsetExact(fd,local_118,0x40,
                                (ulong)elf_header.e_phentsize * (ulong)elf_header.e_flags._2_2_ +
                                elf_header.e_phoff);
    if (bVar2) {
      uVar5 = 0;
      while( true ) {
        if ((elf_header.e_ehsize == uVar5) ||
           (bVar2 = ReadFromOffsetExact(fd,out,0x40,elf_header.e_phoff), !bVar2)) goto LAB_0011f01c;
        if (0x40 < name_len) break;
        sVar4 = ReadFromOffset(fd,&shstrtab.sh_entsize,name_len,out->sh_name + shstrtab.sh_addr);
        bVar2 = sVar4 != 0xffffffffffffffff;
        if ((sVar4 == 0xffffffffffffffff) ||
           ((sVar4 == name_len && (iVar3 = bcmp(&shstrtab.sh_entsize,name,name_len), iVar3 == 0))))
        goto LAB_0011f023;
        elf_header.e_phoff = elf_header.e_phoff + elf_header.e_flags._2_2_;
        uVar5 = uVar5 + 1;
      }
      RawLog__(1,
               "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/symbolize.cc"
               ,0xfc,
               "Section name \'%s\' is too long (%zu); section will not be found (even if present)."
               ,name);
LAB_0011f01c:
      bVar2 = false;
LAB_0011f023:
      bVar2 = (bool)(uVar5 < elf_header.e_ehsize & bVar2);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool GetSectionHeaderByName(int fd, const char *name, size_t name_len,
                            ElfW(Shdr) *out) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) shstrtab;
  size_t shstrtab_offset =
      (elf_header.e_shoff + static_cast<size_t>(elf_header.e_shentsize) *
                                static_cast<size_t>(elf_header.e_shstrndx));
  if (!ReadFromOffsetExact(fd, &shstrtab, sizeof(shstrtab), shstrtab_offset)) {
    return false;
  }

  for (size_t i = 0; i < elf_header.e_shnum; ++i) {
    size_t section_header_offset = (elf_header.e_shoff +
                                   elf_header.e_shentsize * i);
    if (!ReadFromOffsetExact(fd, out, sizeof(*out), section_header_offset)) {
      return false;
    }
    char header_name[kMaxSectionNameLen];
    if (sizeof(header_name) < name_len) {
      RAW_LOG(WARNING, "Section name '%s' is too long (%" PRIuS "); "
              "section will not be found (even if present).", name, name_len);
      // No point in even trying.
      return false;
    }
    size_t name_offset = shstrtab.sh_offset + out->sh_name;
    ssize_t n_read = ReadFromOffset(fd, &header_name, name_len, name_offset);
    if (n_read == -1) {
      return false;
    } else if (static_cast<size_t>(n_read) != name_len) {
      // Short read -- name could be at end of file.
      continue;
    }
    if (memcmp(header_name, name, name_len) == 0) {
      return true;
    }
  }
  return false;
}